

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glcShaderMultisampleInterpolationTests.cpp
# Opt level: O1

void __thiscall
deqp::ShaderMultisampleInterpolationBaseCase::~ShaderMultisampleInterpolationBaseCase
          (ShaderMultisampleInterpolationBaseCase *this)

{
  ~ShaderMultisampleInterpolationBaseCase(this);
  operator_delete(this,0x140);
  return;
}

Assistant:

ShaderMultisampleInterpolationBaseCase::~ShaderMultisampleInterpolationBaseCase()
{
}